

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetCurrentFont(ImFont *font)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  float fVar3;
  float fVar4;
  
  pIVar2 = GImGui;
  GImGui->Font = font;
  fVar4 = (pIVar2->IO).FontGlobalScale * font->FontSize * font->Scale;
  fVar3 = 1.0;
  if (1.0 <= fVar4) {
    fVar3 = fVar4;
  }
  pIVar2->FontBaseSize = fVar3;
  pIVar1 = pIVar2->CurrentWindow;
  if (pIVar1 == (ImGuiWindow *)0x0) {
    fVar3 = 0.0;
  }
  else {
    fVar3 = fVar3 * pIVar1->FontWindowScale * pIVar1->FontDpiScale;
    if (pIVar1->ParentWindow != (ImGuiWindow *)0x0) {
      fVar3 = fVar3 * pIVar1->ParentWindow->FontWindowScale;
    }
  }
  pIVar2->FontSize = fVar3;
  (pIVar2->DrawListSharedData).TexUvWhitePixel = font->ContainerAtlas->TexUvWhitePixel;
  (pIVar2->DrawListSharedData).Font = font;
  (pIVar2->DrawListSharedData).FontSize = fVar3;
  return;
}

Assistant:

void ImGui::SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = ImMax(1.0f, g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale);
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;

    ImFontAtlas* atlas = g.Font->ContainerAtlas;
    g.DrawListSharedData.TexUvWhitePixel = atlas->TexUvWhitePixel;
    g.DrawListSharedData.Font = g.Font;
    g.DrawListSharedData.FontSize = g.FontSize;
}